

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

void caffe::UpgradeNetInput(NetParameter *net_param)

{
  int iVar1;
  int iVar2;
  int32 iVar3;
  LayerParameter *pLVar4;
  InputParameter *this;
  string *value;
  BlobShape *pBVar5;
  BlobShape *from;
  LayerParameter *other;
  int local_48;
  int local_44;
  int i_1;
  int j;
  int last_dim;
  int first_dim;
  BlobShape *shape;
  int i;
  InputParameter *input_param;
  LayerParameter *layer_param;
  bool has_dim;
  bool has_shape;
  NetParameter *net_param_local;
  
  iVar1 = NetParameter::input_shape_size(net_param);
  iVar2 = NetParameter::input_dim_size(net_param);
  if ((0 < iVar1) || (0 < iVar2)) {
    pLVar4 = NetParameter::add_layer(net_param);
    LayerParameter::set_name(pLVar4,"input");
    LayerParameter::set_type(pLVar4,"Input");
    this = LayerParameter::mutable_input_param(pLVar4);
    for (shape._4_4_ = 0; iVar2 = NetParameter::input_size(net_param), shape._4_4_ < iVar2;
        shape._4_4_ = shape._4_4_ + 1) {
      value = NetParameter::input_abi_cxx11_(net_param,shape._4_4_);
      LayerParameter::add_top(pLVar4,value);
      if (0 < iVar1) {
        pBVar5 = InputParameter::add_shape(this);
        from = NetParameter::input_shape(net_param,shape._4_4_);
        BlobShape::CopyFrom(pBVar5,from);
      }
      else {
        pBVar5 = InputParameter::add_shape(this);
        local_44 = shape._4_4_ * 4;
        iVar2 = local_44 + 4;
        for (; local_44 < iVar2; local_44 = local_44 + 1) {
          iVar3 = NetParameter::input_dim(net_param,local_44);
          BlobShape::add_dim(pBVar5,(long)iVar3);
        }
      }
    }
    iVar1 = NetParameter::layer_size(net_param);
    while (local_48 = iVar1 + -1, 0 < local_48) {
      pLVar4 = NetParameter::mutable_layer(net_param,iVar1 + -2);
      other = NetParameter::mutable_layer(net_param,local_48);
      LayerParameter::Swap(pLVar4,other);
      iVar1 = local_48;
    }
  }
  NetParameter::clear_input(net_param);
  NetParameter::clear_input_shape(net_param);
  NetParameter::clear_input_dim(net_param);
  return;
}

Assistant:

void UpgradeNetInput(NetParameter* net_param) {
  // Collect inputs and convert to Input layer definitions.
  // If the NetParameter holds an input alone, without shape/dim, then
  // it's a legacy caffemodel and simply stripping the input field is enough.
  bool has_shape = net_param->input_shape_size() > 0;
  bool has_dim = net_param->input_dim_size() > 0;
  if (has_shape || has_dim) {
    LayerParameter* layer_param = net_param->add_layer();
    layer_param->set_name("input");
    layer_param->set_type("Input");
    InputParameter* input_param = layer_param->mutable_input_param();
    // Convert input fields into a layer.
    for (int i = 0; i < net_param->input_size(); ++i) {
      layer_param->add_top(net_param->input(i));
      if (has_shape) {
        input_param->add_shape()->CopyFrom(net_param->input_shape(i));
      } else {
        // Turn legacy input dimensions into shape.
        BlobShape* shape = input_param->add_shape();
        int first_dim = i*4;
        int last_dim = first_dim + 4;
        for (int j = first_dim; j < last_dim; j++) {
          shape->add_dim(net_param->input_dim(j));
        }
      }
    }
    // Swap input layer to beginning of net to satisfy layer dependencies.
    for (int i = net_param->layer_size() - 1; i > 0; --i) {
      net_param->mutable_layer(i-1)->Swap(net_param->mutable_layer(i));
    }
  }
  // Clear inputs.
  net_param->clear_input();
  net_param->clear_input_shape();
  net_param->clear_input_dim();
}